

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::InputFile::readPixels(InputFile *this,int scanLine1,int scanLine2)

{
  LineOrder LVar1;
  int y;
  Data *pDVar2;
  TiledInputFile *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Iterator IVar15;
  Slice *pSVar16;
  char *pcVar17;
  ArgExc *this_01;
  int x;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  _Rb_tree_color *p_Var23;
  long lVar24;
  long lVar25;
  int x_00;
  _Rb_tree_color *p_Var27;
  int iVar28;
  iterator local_c8;
  Lock local_60;
  TiledInputFile local_50;
  Box2i levelRange;
  ulong uVar26;
  
  local_60._mutex = &this->_data->super_Mutex;
  if (((Data *)local_60._mutex)->compositor != (CompositeDeepScanLine *)0x0) {
    CompositeDeepScanLine::readPixels(((Data *)local_60._mutex)->compositor,scanLine1,scanLine2);
    return;
  }
  if (((Data *)local_60._mutex)->isTiled == true) {
    std::mutex::lock(local_60._mutex);
    local_60._locked = true;
    pDVar2 = this->_data;
    iVar9 = scanLine2;
    iVar18 = scanLine1;
    if (scanLine2 < scanLine1) {
      iVar9 = scanLine1;
      iVar18 = scanLine2;
    }
    iVar28 = pDVar2->minY;
    if ((iVar28 <= iVar18) && (iVar9 <= pDVar2->maxY)) {
      uVar10 = TiledInputFile::tileYSize(pDVar2->tFile);
      iVar19 = pDVar2->minY;
      uVar11 = TiledInputFile::tileYSize(pDVar2->tFile);
      uVar21 = (ulong)(uint)(iVar18 - iVar28) / (ulong)uVar10;
      uVar26 = (ulong)(uint)(iVar9 - iVar19) / (ulong)uVar11;
      LVar1 = pDVar2->lineOrder;
      iVar18 = (int)uVar26 + 1;
      if (LVar1 == DECREASING_Y) {
        iVar18 = (int)uVar21 + -1;
      }
      TiledInputFile::dataWindowForLevel((TiledInputFile *)&levelRange,(int)pDVar2->tFile);
      if (LVar1 == DECREASING_Y) {
        uVar21 = uVar26;
      }
      lVar20 = (long)scanLine1;
      if ((long)scanLine2 < (long)scanLine1) {
        lVar20 = (long)scanLine2;
      }
      while (iVar28 = (int)uVar21, iVar28 != iVar18) {
        TiledInputFile::dataWindowForTile(&local_50,(int)pDVar2->tFile,0,iVar28);
        lVar25 = (long)local_50.super_GenericInputFile._vptr_GenericInputFile._4_4_;
        iVar19 = local_50._data._4_4_;
        if (iVar9 <= local_50._data._4_4_) {
          iVar19 = iVar9;
        }
        if (iVar28 != pDVar2->cachedTileY) {
          this_00 = pDVar2->tFile;
          iVar12 = TiledInputFile::numXTiles(this_00,0);
          TiledInputFile::readTiles(this_00,0,iVar12 + -1,iVar28,iVar28,0);
          pDVar2->cachedTileY = iVar28;
        }
        local_c8._M_node = (_Base_ptr)FrameBuffer::begin(pDVar2->cachedBuffer);
        if (lVar25 < lVar20) {
          lVar25 = lVar20;
        }
        for (; IVar15 = FrameBuffer::end(pDVar2->cachedBuffer),
            (iterator)local_c8._M_node != IVar15._i._M_node;
            local_c8._M_node = (_Base_ptr)std::_Rb_tree_increment(local_c8._M_node)) {
          p_Var3 = local_c8._M_node[9]._M_parent;
          p_Var4 = local_c8._M_node[9]._M_left;
          p_Var5 = local_c8._M_node[9]._M_right;
          pSVar16 = FrameBuffer::operator[](&pDVar2->tFileBuffer,(char *)(local_c8._M_node + 1));
          pcVar6 = pSVar16->base;
          sVar7 = pSVar16->xStride;
          sVar8 = pSVar16->yStride;
          iVar12 = pSVar16->xSampling;
          y = pSVar16->ySampling;
          uVar10 = pixelTypeSize(pSVar16->type);
          p_Var23 = (_Rb_tree_color *)
                    ((long)&p_Var3->_M_color + ((long)levelRange.min.x - 1U) * (long)p_Var4);
          uVar21 = (long)levelRange.min.x;
          do {
            uVar26 = uVar21;
            x_00 = (int)uVar26;
            iVar13 = Imath_2_5::modp(x_00,iVar12);
            p_Var23 = (_Rb_tree_color *)((long)&p_Var4->_M_color + (long)p_Var23);
            uVar21 = (ulong)(x_00 + 1);
          } while (iVar13 != 0);
          lVar24 = lVar25 + -1;
          do {
            iVar13 = Imath_2_5::modp((int)lVar24 + 1,y);
            lVar24 = lVar24 + 1;
          } while (iVar13 != 0);
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (; (int)lVar24 <= iVar19; lVar24 = lVar24 + y) {
            p_Var27 = (_Rb_tree_color *)
                      ((long)p_Var23 +
                      (lVar24 - local_50.super_GenericInputFile._vptr_GenericInputFile._4_4_) *
                      (long)p_Var5);
            iVar13 = Imath_2_5::divp((int)lVar24,y);
            iVar14 = Imath_2_5::divp(x_00,iVar12);
            pcVar17 = pcVar6 + (long)iVar14 * sVar7 + (long)iVar13 * sVar8;
            for (uVar21 = uVar26 & 0xffffffff; (int)uVar21 <= levelRange.max.x;
                uVar21 = (ulong)(uint)((int)uVar21 + iVar12)) {
              for (uVar22 = 0; uVar10 != uVar22; uVar22 = uVar22 + 1) {
                pcVar17[uVar22] = *(char *)((long)p_Var27 + uVar22);
              }
              p_Var27 = (_Rb_tree_color *)((long)p_Var27 + (long)p_Var4 * (long)iVar12);
              pcVar17 = pcVar17 + sVar7;
            }
          }
        }
        uVar21 = (ulong)(iVar28 + (uint)(LVar1 != DECREASING_Y) * 2 + -1);
      }
      IlmThread_2_5::Lock::~Lock(&local_60);
      return;
    }
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (this_01,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  ScanLineInputFile::readPixels(((Data *)local_60._mutex)->sFile,scanLine1,scanLine2);
  return;
}

Assistant:

void
InputFile::readPixels (int scanLine1, int scanLine2)
{
    if (_data->compositor)
    {
        _data->compositor->readPixels(scanLine1,scanLine2);
    }
    else if (_data->isTiled)
    {
	Lock lock (*_data);
        bufferedReadPixels (_data, scanLine1, scanLine2);
    }
    else
    {
        _data->sFile->readPixels (scanLine1, scanLine2);
    }
}